

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O1

diff_t absl::lts_20240722::time_internal::cctz::detail::impl::ymd_ord(year_t y,month_t m,day_t d)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  long lVar5;
  long lVar6;
  
  iVar2 = (int)CONCAT71(in_register_00000031,m);
  iVar3 = iVar2 + -3;
  if (m < '\x03') {
    iVar3 = iVar2 + 9;
  }
  lVar5 = y - (ulong)(m < '\x03');
  lVar6 = lVar5 + -399;
  if (-1 < lVar5) {
    lVar6 = lVar5;
  }
  lVar4 = (lVar6 / 400) * -400;
  lVar1 = lVar4 + lVar5;
  lVar5 = lVar5 + lVar4 + 3;
  if (-1 < lVar1) {
    lVar5 = lVar1;
  }
  lVar4 = SUB168(SEXT816(lVar1) * SEXT816(0x5c28f5c28f5c28f5),8) - lVar1;
  return (lVar6 / 400) * 0x23ab1 +
         (long)((int)CONCAT71(in_register_00000011,d) + (iVar3 * 0x99 + 2) / 5 + -1) + lVar1 * 0x16d
         + (lVar5 >> 2) + ((lVar4 >> 6) - (lVar4 >> 0x3f)) + -0xafa6c;
}

Assistant:

CONSTEXPR_F diff_t ymd_ord(year_t y, month_t m, day_t d) noexcept {
  const diff_t eyear = (m <= 2) ? y - 1 : y;
  const diff_t era = (eyear >= 0 ? eyear : eyear - 399) / 400;
  const diff_t yoe = eyear - era * 400;
  const diff_t doy = (153 * (m + (m > 2 ? -3 : 9)) + 2) / 5 + d - 1;
  const diff_t doe = yoe * 365 + yoe / 4 - yoe / 100 + doy;
  return era * 146097 + doe - 719468;
}